

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

void __thiscall ON_XMLVariant::Format(ON_XMLVariant *this,ON_wString *sOut)

{
  ON_wString this_00;
  int iVar1;
  uint uVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  ON_wString local_38;
  undefined4 local_30;
  ON_wString local_20;
  ON_wString sType;
  ON_wString *sOut_local;
  ON_XMLVariant *this_local;
  
  sType.m_s = (wchar_t *)sOut;
  ON_wString::ON_wString(&local_20);
  switch(this->_private->_type) {
  case Null:
    ON_wString::operator=((ON_wString *)sType.m_s,"[null]");
    local_30 = 1;
    goto LAB_009add5d;
  case Bool:
    ON_wString::operator=(&local_20,L"Bool");
    break;
  case Integer:
    ON_wString::operator=(&local_20,L"Integer");
    break;
  case Float:
    ON_wString::operator=(&local_20,L"Float");
    break;
  case Double:
    ON_wString::operator=(&local_20,L"Double");
    break;
  case String:
    ON_wString::operator=(&local_20,L"String");
    break;
  case DoubleArray2:
    ON_wString::operator=(&local_20,L"DoubleArray2");
    break;
  case DoubleArray3:
    ON_wString::operator=(&local_20,L"DoubleArray3");
    break;
  case DoubleArray4:
    ON_wString::operator=(&local_20,L"DoubleArray4");
    break;
  case DoubleColor4:
    ON_wString::operator=(&local_20,L"DoubleColor4");
    break;
  case Matrix:
    ON_wString::operator=(&local_20,L"Matrix");
    break;
  case Uuid:
    ON_wString::operator=(&local_20,L"UUID");
    break;
  case Time:
    ON_wString::operator=(&local_20,L"Time");
    break;
  case Buffer:
    ON_wString::operator=(&local_20,L"Buffer");
  }
  this_00.m_s = sType.m_s;
  pwVar3 = ON_wString::Array(&local_20);
  (*this->_vptr_ON_XMLVariant[0x2d])(&local_38);
  pwVar4 = ON_wString::Array(&local_38);
  iVar1 = (*this->_vptr_ON_XMLVariant[9])();
  pwVar5 = StringFromUnits((LengthUnitSystem)iVar1);
  uVar2 = (*this->_vptr_ON_XMLVariant[2])(this,0);
  ON_wString::Format((ON_wString *)this_00.m_s,L"Type=%s, Value=%s, Units=%s, CRC=%08X",pwVar3,
                     pwVar4,pwVar5,(ulong)uVar2);
  ON_wString::~ON_wString(&local_38);
  local_30 = 0;
LAB_009add5d:
  ON_wString::~ON_wString(&local_20);
  return;
}

Assistant:

void ON_XMLVariant::Format(ON_wString& sOut) const
{
  ON_wString sType;

  switch (_private->_type)
  {
  case Types::Null:
    sOut = "[null]";
    return;

  case Types::Bool:
    sType = L"Bool";
    break;

  case Types::Float:
    sType = L"Float";
    break;

  case Types::Double:
    sType = L"Double";
    break;

  case Types::Integer:
    sType = L"Integer";
    break;

  case Types::DoubleColor4:
    sType = L"DoubleColor4";
    break;

  case Types::DoubleArray2:
    sType = L"DoubleArray2";
    break;

  case Types::DoubleArray3:
    sType = L"DoubleArray3";
    break;

  case Types::DoubleArray4:
    sType = L"DoubleArray4";
    break;

  case Types::String:
    sType = L"String";
    break;

  case Types::Uuid:
    sType = L"UUID";
    break;

  case Types::Matrix:
    sType = L"Matrix";
    break;

  case Types::Time:
    sType = L"Time";
    break;

  case Types::Buffer:
    sType = L"Buffer";
    break;
  }

  sOut.Format(L"Type=%s, Value=%s, Units=%s, CRC=%08X",
              sType.Array(), AsString().Array(), StringFromUnits(Units()), DataCRC(0));
}